

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O1

void av1_generate_block_hash_value
               (IntraBCHashInfo *intrabc_hash_info,YV12_BUFFER_CONFIG *picture,int block_size,
               uint32_t **src_pic_block_hash,uint32_t **dst_pic_block_hash,
               int8_t **src_pic_block_same_info,int8_t **dst_pic_block_same_info)

{
  uint32_t *puVar1;
  int8_t *piVar2;
  uint32_t **ppuVar3;
  long lVar4;
  long lVar5;
  uint32_t uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  undefined4 in_register_00000014;
  undefined8 uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  uint32_t p [4];
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  int local_12c;
  int local_128;
  int local_124;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  ulong local_a8;
  undefined8 local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  ulong local_70;
  CRC_CALCULATOR *local_68;
  CRC_CALCULATOR *local_60;
  uint32_t **local_58;
  uint32_t **local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar10 = CONCAT44(in_register_00000014,block_size);
  iVar14 = (picture->field_2).field_0.y_crop_width;
  uVar11 = iVar14 - block_size;
  uVar13 = (ulong)uVar11;
  iVar7 = (picture->field_3).field_0.y_crop_height - block_size;
  if (-1 < iVar7) {
    local_68 = &intrabc_hash_info->crc_calculator1;
    local_60 = &intrabc_hash_info->crc_calculator2;
    local_128 = block_size + -1;
    local_b0 = (long)(iVar14 * (block_size >> 2));
    local_b8 = (long)(block_size >> 2);
    local_c0 = (long)(iVar14 * (block_size >> 1));
    local_c8 = (long)(block_size >> 1);
    local_70 = (ulong)(uVar11 + 1);
    local_12c = iVar7 + 1;
    local_d0 = local_c8 * 4;
    local_d8 = local_b8 + local_c0;
    local_e0 = local_c0 * 4;
    local_e8 = local_e0 + local_c8 * 4;
    local_f0 = local_c8 + local_c0;
    local_f8 = local_c8 + local_b0;
    local_98 = 0;
    local_124 = 0;
    local_a8 = uVar13;
    local_a0 = uVar10;
    local_58 = src_pic_block_hash;
    local_50 = dst_pic_block_hash;
    do {
      if (-1 < (int)uVar13) {
        local_48 = (long)(int)local_98;
        local_78 = local_b8 + local_48;
        local_38 = local_48 * 4;
        local_40 = local_d0 + local_48 * 4;
        local_110 = local_c8 + local_48;
        local_90 = local_d8 + local_48;
        local_100 = local_e8 + local_48 * 4;
        local_120 = local_f0 + local_48;
        local_108 = local_e0 + local_48 * 4;
        local_118 = local_c0 + local_48;
        local_88 = local_f8 + local_48;
        local_80 = local_b0 + local_48;
        lVar15 = 0;
        do {
          lVar5 = local_38;
          lVar4 = local_40;
          ppuVar3 = local_58;
          puVar1 = *local_58;
          local_148 = *(undefined4 *)((long)puVar1 + lVar15 * 4 + local_38);
          local_144 = *(undefined4 *)((long)puVar1 + lVar15 * 4 + local_40);
          local_140 = *(undefined4 *)((long)puVar1 + lVar15 * 4 + local_108);
          local_13c = *(undefined4 *)((long)puVar1 + lVar15 * 4 + local_100);
          uVar6 = av1_get_crc_value(local_68,(uint8_t *)&local_148,0x10);
          *(uint32_t *)((long)*dst_pic_block_hash + lVar15 * 4 + lVar5) = uVar6;
          puVar1 = ppuVar3[1];
          local_148 = *(undefined4 *)((long)puVar1 + lVar15 * 4 + lVar5);
          local_144 = *(undefined4 *)((long)puVar1 + lVar15 * 4 + lVar4);
          local_140 = *(undefined4 *)((long)puVar1 + lVar15 * 4 + local_108);
          local_13c = *(undefined4 *)((long)puVar1 + lVar15 * 4 + local_100);
          uVar6 = av1_get_crc_value(local_60,(uint8_t *)&local_148,0x10);
          *(uint32_t *)((long)dst_pic_block_hash[1] + lVar15 * 4 + lVar5) = uVar6;
          piVar2 = *src_pic_block_same_info;
          if (piVar2[lVar15 + local_48] == '\0') {
            bVar16 = false;
          }
          else if ((((piVar2[lVar15 + local_78] == '\0') || (piVar2[lVar15 + local_110] == '\0')) ||
                   (piVar2[lVar15 + local_118] == '\0')) || (piVar2[lVar15 + local_90] == '\0')) {
            bVar16 = false;
          }
          else {
            bVar16 = piVar2[lVar15 + local_120] != '\0';
          }
          (*dst_pic_block_same_info)[lVar15 + local_48] = bVar16;
          piVar2 = src_pic_block_same_info[1];
          if (((piVar2[lVar15 + local_48] == '\0') || (piVar2[lVar15 + local_110] == '\0')) ||
             ((piVar2[lVar15 + local_80] == '\0' ||
              ((piVar2[lVar15 + local_88] == '\0' || (piVar2[lVar15 + local_118] == '\0')))))) {
            bVar16 = false;
          }
          else {
            bVar16 = piVar2[lVar15 + local_120] != '\0';
          }
          dst_pic_block_same_info[1][lVar15 + local_48] = bVar16;
          lVar15 = lVar15 + 1;
        } while ((int)local_70 != (int)lVar15);
        local_98 = (ulong)(uint)((int)local_98 + (int)lVar15);
        uVar10 = local_a0;
        uVar13 = local_a8;
      }
      uVar11 = (uint)uVar13;
      local_98 = (ulong)(uint)((int)local_98 + local_128);
      local_124 = local_124 + 1;
    } while (local_124 != local_12c);
  }
  if ((3 < (int)uVar10) && (-1 < iVar7)) {
    uVar9 = (int)uVar10 - 1;
    uVar8 = 0;
    uVar13 = 0;
    do {
      iVar14 = (int)uVar13;
      if (-1 < (int)uVar11) {
        uVar12 = 0;
        do {
          if (((*dst_pic_block_same_info)[uVar13] == '\0') &&
             (dst_pic_block_same_info[1][uVar13] == '\0')) {
            bVar16 = true;
          }
          else {
            bVar16 = ((uVar12 | uVar8) & uVar9) == 0;
          }
          dst_pic_block_same_info[2][uVar13] = bVar16;
          uVar13 = uVar13 + 1;
          uVar12 = uVar12 + 1;
        } while (uVar11 + 1 != uVar12);
        iVar14 = iVar14 + uVar12;
      }
      uVar13 = (ulong)(iVar14 + uVar9);
      uVar8 = uVar8 + 1;
    } while (uVar8 != iVar7 + 1U);
  }
  return;
}

Assistant:

void av1_generate_block_hash_value(IntraBCHashInfo *intrabc_hash_info,
                                   const YV12_BUFFER_CONFIG *picture,
                                   int block_size,
                                   uint32_t *src_pic_block_hash[2],
                                   uint32_t *dst_pic_block_hash[2],
                                   int8_t *src_pic_block_same_info[3],
                                   int8_t *dst_pic_block_same_info[3]) {
  CRC_CALCULATOR *calc_1 = &intrabc_hash_info->crc_calculator1;
  CRC_CALCULATOR *calc_2 = &intrabc_hash_info->crc_calculator2;

  const int pic_width = picture->y_crop_width;
  const int x_end = picture->y_crop_width - block_size + 1;
  const int y_end = picture->y_crop_height - block_size + 1;

  const int src_size = block_size >> 1;
  const int quad_size = block_size >> 2;

  uint32_t p[4];
  const int length = sizeof(p);

  int pos = 0;
  for (int y_pos = 0; y_pos < y_end; y_pos++) {
    for (int x_pos = 0; x_pos < x_end; x_pos++) {
      p[0] = src_pic_block_hash[0][pos];
      p[1] = src_pic_block_hash[0][pos + src_size];
      p[2] = src_pic_block_hash[0][pos + src_size * pic_width];
      p[3] = src_pic_block_hash[0][pos + src_size * pic_width + src_size];
      dst_pic_block_hash[0][pos] =
          av1_get_crc_value(calc_1, (uint8_t *)p, length);

      p[0] = src_pic_block_hash[1][pos];
      p[1] = src_pic_block_hash[1][pos + src_size];
      p[2] = src_pic_block_hash[1][pos + src_size * pic_width];
      p[3] = src_pic_block_hash[1][pos + src_size * pic_width + src_size];
      dst_pic_block_hash[1][pos] =
          av1_get_crc_value(calc_2, (uint8_t *)p, length);

      dst_pic_block_same_info[0][pos] =
          src_pic_block_same_info[0][pos] &&
          src_pic_block_same_info[0][pos + quad_size] &&
          src_pic_block_same_info[0][pos + src_size] &&
          src_pic_block_same_info[0][pos + src_size * pic_width] &&
          src_pic_block_same_info[0][pos + src_size * pic_width + quad_size] &&
          src_pic_block_same_info[0][pos + src_size * pic_width + src_size];

      dst_pic_block_same_info[1][pos] =
          src_pic_block_same_info[1][pos] &&
          src_pic_block_same_info[1][pos + src_size] &&
          src_pic_block_same_info[1][pos + quad_size * pic_width] &&
          src_pic_block_same_info[1][pos + quad_size * pic_width + src_size] &&
          src_pic_block_same_info[1][pos + src_size * pic_width] &&
          src_pic_block_same_info[1][pos + src_size * pic_width + src_size];
      pos++;
    }
    pos += block_size - 1;
  }

  if (block_size >= 4) {
    const int size_minus_1 = block_size - 1;
    pos = 0;
    for (int y_pos = 0; y_pos < y_end; y_pos++) {
      for (int x_pos = 0; x_pos < x_end; x_pos++) {
        dst_pic_block_same_info[2][pos] =
            (!dst_pic_block_same_info[0][pos] &&
             !dst_pic_block_same_info[1][pos]) ||
            (((x_pos & size_minus_1) == 0) && ((y_pos & size_minus_1) == 0));
        pos++;
      }
      pos += block_size - 1;
    }
  }
}